

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

int compaction_del_cb(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,
                     fdb_doc *doc,uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  fdb_seqnum_t seqnum;
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  fdb_kvs_handle *pfVar5;
  long extraout_RDX;
  char *pcVar6;
  char *pcVar7;
  fdb_kvs_handle *pfVar8;
  uint uVar9;
  uint uVar10;
  ulong unaff_RBP;
  ulong uVar11;
  fdb_kvs_handle **ptr_handle;
  fdb_file_handle *pfVar12;
  fdb_iterator *pfVar13;
  fdb_kvs_handle *pfVar14;
  long lVar15;
  fdb_kvs_handle *unaff_R13;
  ulong uVar16;
  fdb_doc **doc_00;
  char *pcVar17;
  fdb_kvs_info *info;
  fdb_kvs_handle *doc_01;
  undefined4 uVar18;
  undefined4 uVar19;
  fdb_kvs_handle *db;
  timeval __test_begin;
  char keybuf [256];
  fdb_file_handle *pfStackY_1630;
  timeval tStackY_1628;
  fdb_config fStackY_1618;
  code *pcStackY_1520;
  fdb_snapshot_info_t *pfStackY_1518;
  ulong uStackY_1510;
  fdb_kvs_handle *pfStackY_1508;
  fdb_kvs_handle *pfStackY_1500;
  fdb_kvs_config fStackY_14f8;
  timeval tStackY_14e0;
  char *pcStackY_14d0;
  char *pcStackY_14c8;
  fdb_kvs_handle *pfStackY_14c0;
  char *pcStackY_14b8;
  char *pcStackY_14b0;
  code *pcStackY_14a8;
  fdb_file_handle *pfStackY_1498;
  int iStackY_148c;
  fdb_kvs_handle *pfStackY_1488;
  fdb_kvs_handle *pfStackY_1480;
  fdb_kvs_handle *pfStackY_1478;
  fdb_kvs_handle *pfStackY_1470;
  fdb_kvs_handle *pfStackY_1468;
  undefined8 uStackY_1460;
  undefined8 uStackY_1458;
  undefined8 uStackY_1450;
  timeval tStackY_1440;
  fdb_kvs_config fStackY_1430;
  fdb_config fStackY_1418;
  char acStackY_1320 [256];
  char acStackY_1220 [272];
  char *pcStackY_1110;
  fdb_kvs_handle *pfStackY_1108;
  char *pcStackY_10f8;
  code *pcStackY_10f0;
  fdb_snapshot_info_t *pfStackY_10e0;
  fdb_kvs_handle *pfStackY_10d8;
  uint64_t uStackY_10d0;
  timeval tStackY_10c8;
  size_t sStackY_10b8;
  fdb_kvs_handle **ppfStackY_10b0;
  code *pcStackY_10a8;
  fdb_kvs_handle *pfStackY_10a0;
  fdb_kvs_handle *pfStackY_1098;
  fdb_kvs_handle *pfStackY_1090;
  fdb_kvs_handle *pfStackY_1088;
  undefined8 uStackY_1080;
  undefined8 uStackY_1078;
  fdb_kvs_handle *pfStackY_1070;
  timeval tStackY_1060;
  fdb_kvs_config fStackY_1050;
  fdb_config fStackY_1038;
  char acStackY_f40 [256];
  fdb_kvs_handle *apfStackY_e40 [33];
  fdb_kvs_handle *pfStackY_d38;
  fdb_kvs_handle *pfStackY_d30;
  fdb_kvs_handle *pfStackY_d28;
  char *pcStackY_d20;
  fdb_kvs_handle *pfStackY_d18;
  fdb_kvs_handle *pfStackY_d10;
  fdb_iterator *pfStack_cf8;
  uint uStack_cec;
  fdb_kvs_handle *pfStack_ce8;
  fdb_file_handle *pfStack_ce0;
  fdb_kvs_handle *pfStack_cd8;
  char *pcStack_cd0;
  int iStack_cc8;
  undefined4 uStack_cc4;
  fdb_snapshot_info_t *pfStack_cc0;
  fdb_kvs_handle *pfStack_cb8;
  fdb_kvs_handle *pfStack_cb0;
  long lStack_ca8;
  fdb_kvs_config fStack_ca0;
  char acStack_c88 [256];
  timeval tStack_b88;
  undefined1 auStack_b78 [312];
  size_t sStack_a40;
  undefined1 uStack_a30;
  undefined2 uStack_a28;
  undefined1 uStack_a08;
  list *plStack_990;
  fdb_seqnum_t *pfStack_950;
  fdb_kvs_handle *pfStack_948;
  fdb_kvs_handle *pfStack_940;
  fdb_doc **ppfStack_938;
  fdb_kvs_info *pfStack_930;
  fdb_kvs_handle *pfStack_928;
  fdb_kvs_handle *pfStack_918;
  fdb_kvs_handle *pfStack_910;
  fdb_file_handle *pfStack_908;
  fdb_doc *pfStack_900;
  fdb_iterator *pfStack_8f8;
  fdb_snapshot_info_t *pfStack_8f0;
  uint64_t uStack_8e8;
  fdb_kvs_info fStack_8e0;
  timeval tStack_8b0;
  fdb_kvs_config fStack_8a0;
  fdb_config fStack_888;
  fdb_doc *apfStack_790 [32];
  char *pcStack_690;
  fdb_kvs_handle *pfStack_688;
  fdb_kvs_handle *pfStack_680;
  char *pcStack_678;
  fdb_kvs_handle *pfStack_670;
  fdb_kvs_handle *pfStack_660;
  fdb_file_handle *pfStack_658;
  fdb_snapshot_info_t *pfStack_650;
  uint64_t uStack_648;
  undefined1 auStack_640 [16];
  timeval tStack_630;
  fdb_kvs_config fStack_620;
  fdb_kvs_info fStack_608;
  undefined1 auStack_5d8 [292];
  undefined4 uStack_4b4;
  char *pcStack_3e0;
  fdb_kvs_handle *pfStack_3d8;
  fdb_file_handle *pfStack_3b0;
  uint64_t uStack_3a8;
  fdb_snapshot_info_t *pfStack_3a0;
  fdb_kvs_handle *pfStack_398;
  timeval tStack_390;
  fdb_kvs_config fStack_380;
  fdb_config fStack_368;
  char acStack_270 [256];
  char *pcStack_170;
  void *pvStack_168;
  fdb_kvs_handle *pfStack_160;
  fdb_kvs_handle *pfStack_158;
  code *pcStack_150;
  fdb_kvs_handle *local_148;
  fdb_file_handle *local_140;
  timeval local_138;
  
  pcVar6 = (char *)(ulong)status;
  pcStack_150 = (code *)0x111f33;
  gettimeofday(&local_138,(__timezone_ptr_t)0x0);
  local_148 = *ctx;
  if (status != 0x10) goto LAB_001120b6;
  if (kv_name != (char *)0x0) goto LAB_001120d9;
  if (local_148 == (fdb_kvs_handle *)0x0) {
    return 0;
  }
  pcStack_150 = (code *)0x111f6e;
  fVar1 = fdb_open(&local_140,"./compact_test1",&fhandle->root->config);
  pfVar5 = (fdb_kvs_handle *)kv_name;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001120de;
  pcStack_150 = (code *)0x111f86;
  fdb_kvs_open_default(local_140,&local_148,&local_148->kvs_config);
  pcVar6 = "key%d";
  unaff_RBP = 0;
  do {
    pcStack_150 = (code *)0x111fa3;
    sprintf(&stack0xfffffffffffffed8,"key%d",unaff_RBP);
    pfVar5 = local_148;
    pcStack_150 = (code *)0x111faf;
    sVar3 = strlen(&stack0xfffffffffffffed8);
    pcStack_150 = (code *)0x111fbd;
    fVar1 = fdb_del_kv(pfVar5,&stack0xfffffffffffffed8,sVar3);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_150 = (code *)0x1120ac;
      compaction_del_cb();
      goto LAB_001120ac;
    }
    uVar9 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar9;
  } while (uVar9 != 10);
  pcVar6 = "KEY%d";
  unaff_RBP = 0;
  do {
    pcStack_150 = (code *)0x111fe9;
    sprintf(&stack0xfffffffffffffed8,"KEY%d",unaff_RBP);
    kv_name = (char *)local_148;
    pcStack_150 = (code *)0x111ff5;
    sVar3 = strlen(&stack0xfffffffffffffed8);
    pcStack_150 = (code *)0x112008;
    fVar1 = fdb_set_kv((fdb_kvs_handle *)kv_name,&stack0xfffffffffffffed8,sVar3,(void *)0x0,0);
    pfVar5 = local_148;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001120b1;
    pcStack_150 = (code *)0x11201c;
    sVar3 = strlen(&stack0xfffffffffffffed8);
    pcStack_150 = (code *)0x11202a;
    fVar1 = fdb_del_kv(pfVar5,&stack0xfffffffffffffed8,sVar3);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001120ac;
    uVar9 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar9;
  } while (uVar9 != 10);
  pcVar6 = &stack0xfffffffffffffed8;
  pcStack_150 = (code *)0x112050;
  sprintf(pcVar6,"key%d",10);
  fhandle = (fdb_file_handle *)local_148;
  pcStack_150 = (code *)0x11205c;
  sVar3 = strlen(pcVar6);
  pcStack_150 = (code *)0x11206f;
  fVar1 = fdb_set_kv((fdb_kvs_handle *)fhandle,pcVar6,sVar3,(void *)0x0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001120e3;
  pcStack_150 = (code *)0x11207f;
  fVar1 = fdb_commit(local_140,'\0');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_150 = (code *)0x11208d;
    fdb_close(local_140);
    *(undefined8 *)ctx = 0;
    return 0;
  }
  goto LAB_001120e8;
LAB_00112636:
  pfStack_670 = (fdb_kvs_handle *)0x11263b;
  wal_delete_compact_upto_test();
LAB_0011263b:
  pfStack_670 = (fdb_kvs_handle *)0x112640;
  wal_delete_compact_upto_test();
  goto LAB_00112640;
LAB_001129a8:
  pfStack_928 = (fdb_kvs_handle *)0x1129ad;
  compact_upto_post_snapshot_test();
LAB_001129ad:
  pfStack_928 = (fdb_kvs_handle *)0x1129b2;
  compact_upto_post_snapshot_test();
LAB_001129b2:
  pfStack_928 = (fdb_kvs_handle *)0x1129b7;
  compact_upto_post_snapshot_test();
  goto LAB_001129b7;
LAB_0011305f:
  pfStackY_d10 = (fdb_kvs_handle *)0x113064;
  compact_upto_overwrite_test();
LAB_00113064:
  pfStackY_d10 = (fdb_kvs_handle *)0x113069;
  compact_upto_overwrite_test();
LAB_00113069:
  pfVar5 = (fdb_kvs_handle *)(auStack_b78 + 0x30);
  pfStackY_d10 = (fdb_kvs_handle *)0x11306e;
  compact_upto_overwrite_test();
LAB_0011306e:
  pfStackY_d10 = (fdb_kvs_handle *)0x11307e;
  compact_upto_overwrite_test();
LAB_0011307e:
  pfStackY_d10 = (fdb_kvs_handle *)0x113089;
  compact_upto_overwrite_test();
LAB_00113089:
  pfStackY_d10 = (fdb_kvs_handle *)0x11308e;
  compact_upto_overwrite_test();
LAB_0011308e:
  pfStackY_d10 = (fdb_kvs_handle *)0x113093;
  compact_upto_overwrite_test();
LAB_00113093:
  pfStackY_d10 = (fdb_kvs_handle *)0x113098;
  compact_upto_overwrite_test();
LAB_00113098:
  pfStackY_d10 = (fdb_kvs_handle *)0x11309d;
  compact_upto_overwrite_test();
LAB_0011309d:
  pfStackY_d10 = (fdb_kvs_handle *)0x1130a2;
  compact_upto_overwrite_test();
LAB_001130a2:
  pfStackY_d10 = (fdb_kvs_handle *)0x1130a7;
  compact_upto_overwrite_test();
  goto LAB_001130a7;
LAB_001120ac:
  pcStack_150 = (code *)0x1120b1;
  compaction_del_cb();
  kv_name = (char *)pfVar5;
LAB_001120b1:
  fhandle = (fdb_file_handle *)&stack0xfffffffffffffed8;
  pcStack_150 = (code *)0x1120b6;
  compaction_del_cb();
LAB_001120b6:
  iVar2 = (int)pcVar6;
  if (iVar2 == 8) {
LAB_001120cf:
    pcStack_150 = (code *)0x1120d4;
    compaction_del_cb();
  }
  else {
    if (iVar2 == 2) {
LAB_001120ca:
      pcStack_150 = (code *)0x1120cf;
      compaction_del_cb();
      goto LAB_001120cf;
    }
    if (iVar2 == 1) {
      pcStack_150 = (code *)0x1120ca;
      compaction_del_cb();
      goto LAB_001120ca;
    }
  }
  pcStack_150 = (code *)0x1120d9;
  compaction_del_cb();
LAB_001120d9:
  pcStack_150 = (code *)0x1120de;
  compaction_del_cb();
  pfVar5 = (fdb_kvs_handle *)kv_name;
LAB_001120de:
  pcStack_150 = (code *)0x1120e3;
  compaction_del_cb();
LAB_001120e3:
  pcStack_150 = (code *)0x1120e8;
  compaction_del_cb();
LAB_001120e8:
  pcStack_150 = compact_upto_twice_test;
  compaction_del_cb();
  pvStack_168 = ctx;
  pcStack_170 = pcVar6;
  pfStack_160 = (fdb_kvs_handle *)fhandle;
  pfStack_158 = pfVar5;
  pcStack_150 = (code *)unaff_RBP;
  gettimeofday(&tStack_390,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_368.wal_threshold = 0x400;
  fStack_368.flags = 1;
  fStack_368.block_reusing_threshold = 0;
  fdb_open(&pfStack_3b0,"./compact_test1",&fStack_368);
  fdb_kvs_open_default(pfStack_3b0,&pfStack_398,&fStack_380);
  uVar11 = 0;
  do {
    sprintf(acStack_270,"key%d",uVar11);
    pfVar5 = pfStack_398;
    sVar3 = strlen(acStack_270);
    fVar1 = fdb_set_kv(pfVar5,acStack_270,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      compact_upto_twice_test();
      goto LAB_001122df;
    }
    fdb_commit(pfStack_3b0,'\x01');
    uVar9 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar9;
  } while (uVar9 != 10);
  fVar1 = fdb_get_all_snap_markers(pfStack_3b0,&pfStack_3a0,&uStack_3a8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_compact_upto(pfStack_3b0,(char *)0x0,pfStack_3a0[uStack_3a8 - 1].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001122e4;
    fVar1 = fdb_free_snap_markers(pfStack_3a0,uStack_3a8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001122e9;
    fVar1 = fdb_get_all_snap_markers(pfStack_3b0,&pfStack_3a0,&uStack_3a8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001122ee;
    fVar1 = fdb_compact_upto(pfStack_3b0,(char *)0x0,pfStack_3a0[uStack_3a8 - 2].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001122f3;
    fVar1 = fdb_free_snap_markers(pfStack_3a0,uStack_3a8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_close(pfStack_3b0);
      fdb_shutdown();
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (compact_upto_twice_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      iVar2 = fprintf(_stderr,pcVar6,"compact upto twice");
      return iVar2;
    }
  }
  else {
LAB_001122df:
    compact_upto_twice_test();
LAB_001122e4:
    compact_upto_twice_test();
LAB_001122e9:
    compact_upto_twice_test();
LAB_001122ee:
    compact_upto_twice_test();
LAB_001122f3:
    compact_upto_twice_test();
  }
  compact_upto_twice_test();
  pfStack_3d8 = pfVar5;
  pcStack_3e0 = "key%d";
  pfStack_670 = (fdb_kvs_handle *)0x11231a;
  gettimeofday(&tStack_630,(__timezone_ptr_t)0x0);
  pfStack_670 = (fdb_kvs_handle *)0x11231f;
  memleak_start();
  pfStack_670 = (fdb_kvs_handle *)0x11232b;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_670 = (fdb_kvs_handle *)0x11233b;
  fdb_get_default_config();
  pfStack_670 = (fdb_kvs_handle *)0x112348;
  fdb_get_default_kvs_config();
  auStack_5d8._272_8_ = (void *)0x13;
  uStack_4b4 = 1;
  pfStack_670 = (fdb_kvs_handle *)0x11236e;
  fdb_open(&pfStack_658,"./compact_test5",(fdb_config *)(auStack_5d8 + 0x100));
  pfStack_670 = (fdb_kvs_handle *)0x11237e;
  fdb_kvs_open_default(pfStack_658,&pfStack_660,&fStack_620);
  pcVar7 = "key%d";
  pcVar6 = auStack_5d8;
  pcVar17 = "value";
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_670 = (fdb_kvs_handle *)0x1123a5;
    sprintf(pcVar6,"key%d",pfVar5);
    pfVar14 = pfStack_660;
    pfStack_670 = (fdb_kvs_handle *)0x1123b2;
    sVar3 = strlen(pcVar6);
    pfStack_670 = (fdb_kvs_handle *)0x1123c9;
    fVar1 = fdb_set_kv(pfVar14,pcVar6,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_670 = (fdb_kvs_handle *)0x112636;
      wal_delete_compact_upto_test();
      goto LAB_00112636;
    }
    uVar9 = (int)pfVar5 + 1;
    pfVar5 = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_670 = (fdb_kvs_handle *)0x1123e7;
  fVar1 = fdb_commit(pfStack_658,'\x01');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar7 = (char *)0xa;
    pcVar6 = "key%d";
    pcVar17 = auStack_5d8;
    pfVar14 = (fdb_kvs_handle *)0x14df20;
    do {
      pfStack_670 = (fdb_kvs_handle *)0x112419;
      sprintf(pcVar17,"key%d",pcVar7);
      unaff_R13 = pfStack_660;
      pfStack_670 = (fdb_kvs_handle *)0x112426;
      sVar3 = strlen(pcVar17);
      pfStack_670 = (fdb_kvs_handle *)0x11243d;
      fVar1 = fdb_set_kv(unaff_R13,pcVar17,sVar3,"value",5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112636;
      uVar9 = (int)pcVar7 + 1;
      pcVar7 = (char *)(ulong)uVar9;
    } while (uVar9 != 0x14);
    pcVar7 = (char *)0xf;
    pcVar6 = "key%d";
    pcVar17 = auStack_5d8;
    do {
      pfStack_670 = (fdb_kvs_handle *)0x11246f;
      sprintf(pcVar17,"key%d",pcVar7);
      pfVar14 = pfStack_660;
      pfStack_670 = (fdb_kvs_handle *)0x11247c;
      sVar3 = strlen(pcVar17);
      pfStack_670 = (fdb_kvs_handle *)0x11248a;
      fVar1 = fdb_del_kv(pfVar14,pcVar17,sVar3);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011263b;
      uVar9 = (int)pcVar7 + 1;
      pcVar7 = (char *)(ulong)uVar9;
    } while (uVar9 != 0x14);
    pfStack_670 = (fdb_kvs_handle *)0x1124a5;
    fVar1 = fdb_commit(pfStack_658,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011264a;
    pcVar7 = auStack_5d8;
    pfStack_670 = (fdb_kvs_handle *)0x1124cb;
    sprintf(pcVar7,"key%d",0x14);
    pcVar6 = (char *)pfStack_660;
    pfStack_670 = (fdb_kvs_handle *)0x1124d8;
    sVar3 = strlen(pcVar7);
    pfStack_670 = (fdb_kvs_handle *)0x1124f3;
    fVar1 = fdb_set_kv((fdb_kvs_handle *)pcVar6,pcVar7,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011264f;
    pfStack_670 = (fdb_kvs_handle *)0x112507;
    fVar1 = fdb_commit(pfStack_658,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112654;
    pfStack_670 = (fdb_kvs_handle *)0x112523;
    fVar1 = fdb_get_all_snap_markers(pfStack_658,&pfStack_650,&uStack_648);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112659;
    pfStack_670 = (fdb_kvs_handle *)0x112540;
    fVar1 = fdb_compact_upto(pfStack_658,(char *)0x0,pfStack_650[1].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011265e;
    pfStack_670 = (fdb_kvs_handle *)0x112557;
    fVar1 = fdb_free_snap_markers(pfStack_650,uStack_648);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112663;
    pfStack_670 = (fdb_kvs_handle *)0x11256e;
    fVar1 = fdb_get_kvs_info(pfStack_660,&fStack_608);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcVar7 = (char *)0xf;
      pcVar6 = "key%d";
      pcVar17 = auStack_5d8;
      pfVar14 = (fdb_kvs_handle *)(auStack_640 + 8);
      unaff_R13 = (fdb_kvs_handle *)auStack_640;
      while( true ) {
        pfStack_670 = (fdb_kvs_handle *)0x1125a3;
        sprintf(pcVar17,"key%d",pcVar7);
        pfVar5 = pfStack_660;
        pfStack_670 = (fdb_kvs_handle *)0x1125b0;
        sVar3 = strlen(pcVar17);
        pfStack_670 = (fdb_kvs_handle *)0x1125c4;
        fVar1 = fdb_get_kv(pfVar5,pcVar17,sVar3,(void **)pfVar14,(size_t *)unaff_R13);
        if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) break;
        uVar9 = (int)pcVar7 + 1;
        pcVar7 = (char *)(ulong)uVar9;
        if (uVar9 == 0x14) {
          pfStack_670 = (fdb_kvs_handle *)0x1125da;
          fdb_kvs_close(pfStack_660);
          pfStack_670 = (fdb_kvs_handle *)0x1125e4;
          fdb_close(pfStack_658);
          pfStack_670 = (fdb_kvs_handle *)0x1125e9;
          fdb_shutdown();
          pfStack_670 = (fdb_kvs_handle *)0x1125ee;
          memleak_end();
          pcVar6 = "%s PASSED\n";
          if (wal_delete_compact_upto_test()::__test_pass != '\0') {
            pcVar6 = "%s FAILED\n";
          }
          pfStack_670 = (fdb_kvs_handle *)0x11261f;
          iVar2 = fprintf(_stderr,pcVar6,"compact upto with wal deletes test");
          return iVar2;
        }
      }
LAB_00112640:
      pfStack_670 = (fdb_kvs_handle *)0x112645;
      wal_delete_compact_upto_test();
      goto LAB_00112645;
    }
  }
  else {
LAB_00112645:
    pfStack_670 = (fdb_kvs_handle *)0x11264a;
    wal_delete_compact_upto_test();
LAB_0011264a:
    pfStack_670 = (fdb_kvs_handle *)0x11264f;
    wal_delete_compact_upto_test();
LAB_0011264f:
    pfStack_670 = (fdb_kvs_handle *)0x112654;
    wal_delete_compact_upto_test();
LAB_00112654:
    pfStack_670 = (fdb_kvs_handle *)0x112659;
    wal_delete_compact_upto_test();
LAB_00112659:
    pfStack_670 = (fdb_kvs_handle *)0x11265e;
    wal_delete_compact_upto_test();
LAB_0011265e:
    pfStack_670 = (fdb_kvs_handle *)0x112663;
    wal_delete_compact_upto_test();
LAB_00112663:
    pfStack_670 = (fdb_kvs_handle *)0x112668;
    wal_delete_compact_upto_test();
  }
  pfStack_670 = (fdb_kvs_handle *)compact_upto_post_snapshot_test;
  wal_delete_compact_upto_test();
  pfStack_928 = (fdb_kvs_handle *)0x11268b;
  pcStack_690 = pcVar7;
  pfStack_688 = pfVar14;
  pfStack_680 = (fdb_kvs_handle *)pcVar6;
  pcStack_678 = pcVar17;
  pfStack_670 = pfVar5;
  gettimeofday(&tStack_8b0,(__timezone_ptr_t)0x0);
  pfStack_928 = (fdb_kvs_handle *)0x112690;
  memleak_start();
  pfStack_900 = (fdb_doc *)0x0;
  pfStack_928 = (fdb_kvs_handle *)0x1126a1;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_928 = (fdb_kvs_handle *)0x1126b1;
  fdb_get_default_config();
  pfStack_928 = (fdb_kvs_handle *)0x1126c1;
  fdb_get_default_kvs_config();
  fStack_888.wal_threshold = 0x400;
  fStack_888.flags = 1;
  fStack_888.block_reusing_threshold = 0;
  pfStack_928 = (fdb_kvs_handle *)0x1126ee;
  fdb_open(&pfStack_908,"./compact_test1",&fStack_888);
  pfStack_928 = (fdb_kvs_handle *)0x1126fe;
  fdb_kvs_open_default(pfStack_908,&pfStack_910,&fStack_8a0);
  pcVar6 = "key%d";
  doc_00 = apfStack_790;
  info = (fdb_kvs_info *)0x14df20;
  pcVar7 = (char *)0x0;
  do {
    pfStack_928 = (fdb_kvs_handle *)0x112725;
    sprintf((char *)doc_00,"key%d",pcVar7);
    pfVar5 = pfStack_910;
    pfStack_928 = (fdb_kvs_handle *)0x112732;
    sVar3 = strlen((char *)doc_00);
    pfStack_928 = (fdb_kvs_handle *)0x112749;
    pfVar14 = pfVar5;
    fVar1 = fdb_set_kv(pfVar5,doc_00,sVar3,"value",5);
    uVar9 = (uint)pfVar14;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_928 = (fdb_kvs_handle *)0x1129a8;
      compact_upto_post_snapshot_test();
      goto LAB_001129a8;
    }
    pfStack_928 = (fdb_kvs_handle *)0x112760;
    fdb_commit(pfStack_908,'\x01');
    uVar9 = (int)pcVar7 + 1;
    pcVar7 = (char *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_928 = (fdb_kvs_handle *)0x112776;
  pfVar14 = pfStack_910;
  fVar1 = fdb_get_kvs_info(pfStack_910,&fStack_8e0);
  uVar9 = (uint)pfVar14;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar6 = (char *)&fStack_8e0.last_seqnum;
    if (fStack_8e0.last_seqnum != 10) {
      pfStack_928 = (fdb_kvs_handle *)0x112791;
      compact_upto_post_snapshot_test();
    }
    pfStack_928 = (fdb_kvs_handle *)0x1127a5;
    pfVar14 = pfStack_910;
    fVar1 = fdb_snapshot_open(pfStack_910,&pfStack_918,5);
    uVar9 = (uint)pfVar14;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129bc;
    pfStack_928 = (fdb_kvs_handle *)0x1127bc;
    pfVar14 = pfStack_918;
    fVar1 = fdb_get_kvs_info(pfStack_918,&fStack_8e0);
    uVar9 = (uint)pfVar14;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129c1;
    if (fStack_8e0.last_seqnum != 5) {
      pfStack_928 = (fdb_kvs_handle *)0x1127d4;
      compact_upto_post_snapshot_test();
    }
    pfStack_928 = (fdb_kvs_handle *)0x1127e8;
    pfVar12 = pfStack_908;
    fVar1 = fdb_get_all_snap_markers(pfStack_908,&pfStack_8f0,&uStack_8e8);
    uVar9 = (uint)pfVar12;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129c6;
    pfStack_928 = (fdb_kvs_handle *)0x112805;
    pfVar12 = pfStack_908;
    fVar1 = fdb_compact_upto(pfStack_908,(char *)0x0,pfStack_8f0[5].marker);
    uVar9 = (uint)pfVar12;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129cb;
    pfStack_928 = (fdb_kvs_handle *)0x11281c;
    fVar1 = fdb_free_snap_markers(pfStack_8f0,uStack_8e8);
    uVar9 = (uint)pfStack_8f0;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129d0;
    pfStack_928 = (fdb_kvs_handle *)0x112833;
    pfVar14 = pfStack_910;
    fVar1 = fdb_get_kvs_info(pfStack_910,&fStack_8e0);
    uVar9 = (uint)pfVar14;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129d5;
    if (fStack_8e0.last_seqnum != 10) {
      pfStack_928 = (fdb_kvs_handle *)0x11284b;
      compact_upto_post_snapshot_test();
    }
    pfStack_928 = (fdb_kvs_handle *)0x11285a;
    pfVar14 = pfStack_918;
    fVar1 = fdb_get_kvs_info(pfStack_918,&fStack_8e0);
    uVar9 = (uint)pfVar14;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129da;
    if (fStack_8e0.last_seqnum != 5) {
      pfStack_928 = (fdb_kvs_handle *)0x112872;
      compact_upto_post_snapshot_test();
    }
    pfStack_928 = (fdb_kvs_handle *)0x112892;
    pfVar14 = pfStack_918;
    fVar1 = fdb_iterator_init(pfStack_918,&pfStack_8f8,(void *)0x0,0,(void *)0x0,0,0);
    uVar9 = (uint)pfVar14;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129df;
    pcVar7 = (char *)0x5;
    doc_00 = &pfStack_900;
    info = &fStack_8e0;
    do {
      pfStack_928 = (fdb_kvs_handle *)0x1128b6;
      pfVar13 = pfStack_8f8;
      fVar1 = fdb_iterator_get(pfStack_8f8,doc_00);
      uVar9 = (uint)pfVar13;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129a8;
      pfStack_928 = (fdb_kvs_handle *)0x1128c8;
      fdb_doc_free(pfStack_900);
      pfStack_900 = (fdb_doc *)0x0;
      pfStack_928 = (fdb_kvs_handle *)0x1128de;
      pfVar14 = pfStack_910;
      fVar1 = fdb_get_kvs_info(pfStack_910,info);
      uVar9 = (uint)pfVar14;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129ad;
      if (fStack_8e0.last_seqnum != 10) {
        pfStack_928 = (fdb_kvs_handle *)0x112926;
        compact_upto_post_snapshot_test();
      }
      pfStack_928 = (fdb_kvs_handle *)0x1128fb;
      pfVar14 = pfStack_918;
      fVar1 = fdb_get_kvs_info(pfStack_918,info);
      uVar9 = (uint)pfVar14;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129b2;
      if (fStack_8e0.last_seqnum != 5) {
        pfStack_928 = (fdb_kvs_handle *)0x112930;
        compact_upto_post_snapshot_test();
      }
      pfStack_928 = (fdb_kvs_handle *)0x112915;
      pfVar13 = pfStack_8f8;
      fVar1 = fdb_iterator_next(pfStack_8f8);
      uVar9 = (uint)pfVar13;
      uVar10 = (int)pcVar7 - 1;
      pcVar7 = (char *)(ulong)uVar10;
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar10 == 0) {
      pfStack_928 = (fdb_kvs_handle *)0x112944;
      fdb_iterator_close(pfStack_8f8);
      pfStack_928 = (fdb_kvs_handle *)0x11294e;
      fdb_kvs_close(pfStack_918);
      pfStack_928 = (fdb_kvs_handle *)0x112958;
      fdb_close(pfStack_908);
      pfStack_928 = (fdb_kvs_handle *)0x11295d;
      fdb_shutdown();
      pfStack_928 = (fdb_kvs_handle *)0x112962;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (compact_upto_post_snapshot_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_928 = (fdb_kvs_handle *)0x112993;
      iVar2 = fprintf(_stderr,pcVar6,"compact upto post snapshot test");
      return iVar2;
    }
  }
  else {
LAB_001129b7:
    pfStack_928 = (fdb_kvs_handle *)0x1129bc;
    compact_upto_post_snapshot_test();
LAB_001129bc:
    pfStack_928 = (fdb_kvs_handle *)0x1129c1;
    compact_upto_post_snapshot_test();
LAB_001129c1:
    pfStack_928 = (fdb_kvs_handle *)0x1129c6;
    compact_upto_post_snapshot_test();
LAB_001129c6:
    pfStack_928 = (fdb_kvs_handle *)0x1129cb;
    compact_upto_post_snapshot_test();
LAB_001129cb:
    pfStack_928 = (fdb_kvs_handle *)0x1129d0;
    compact_upto_post_snapshot_test();
LAB_001129d0:
    pfStack_928 = (fdb_kvs_handle *)0x1129d5;
    compact_upto_post_snapshot_test();
LAB_001129d5:
    pfStack_928 = (fdb_kvs_handle *)0x1129da;
    compact_upto_post_snapshot_test();
LAB_001129da:
    pfStack_928 = (fdb_kvs_handle *)0x1129df;
    compact_upto_post_snapshot_test();
LAB_001129df:
    pfStack_928 = (fdb_kvs_handle *)0x1129e4;
    compact_upto_post_snapshot_test();
  }
  pfStack_928 = (fdb_kvs_handle *)compact_upto_overwrite_test;
  compact_upto_post_snapshot_test();
  pfStack_948 = pfVar5;
  doc_01 = (fdb_kvs_handle *)0x0;
  pfStackY_d10 = (fdb_kvs_handle *)0x112a10;
  uStack_cec = uVar9;
  pfStack_950 = (fdb_seqnum_t *)pcVar6;
  pfStack_940 = unaff_R13;
  ppfStack_938 = doc_00;
  pfStack_930 = info;
  pfStack_928 = (fdb_kvs_handle *)pcVar7;
  gettimeofday(&tStack_b88,(__timezone_ptr_t)0x0);
  builtin_strncpy(acStack_c88,"rm -rf  compact_test* > errorlog.txt",0x25);
  pfStackY_d10 = (fdb_kvs_handle *)0x112a40;
  system(acStack_c88);
  pfStackY_d10 = (fdb_kvs_handle *)0x112a45;
  memleak_start();
  pfStackY_d10 = (fdb_kvs_handle *)0x112a4f;
  pcVar6 = (char *)malloc(0x20);
  pfVar14 = (fdb_kvs_handle *)(auStack_b78 + 0x130);
  pfStackY_d10 = (fdb_kvs_handle *)0x112a62;
  fdb_get_default_config();
  uStack_a28 = 0x201;
  uStack_a30 = 1;
  uStack_a08 = 1;
  sStack_a40 = 0;
  plStack_990 = (list *)0x0;
  pfStackY_d10 = (fdb_kvs_handle *)0x112a85;
  fdb_get_default_kvs_config();
  pfStackY_d10 = (fdb_kvs_handle *)0x112a99;
  fVar1 = fdb_open(&pfStack_ce0,"./compact_test",(fdb_config *)pfVar14);
  if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_001130a7:
    pfStackY_d10 = (fdb_kvs_handle *)0x1130ac;
    compact_upto_overwrite_test();
LAB_001130ac:
    pfStackY_d10 = (fdb_kvs_handle *)0x1130b1;
    compact_upto_overwrite_test();
LAB_001130b1:
    pfStackY_d10 = (fdb_kvs_handle *)0x1130b6;
    compact_upto_overwrite_test();
LAB_001130b6:
    pfStackY_d10 = (fdb_kvs_handle *)0x1130bb;
    compact_upto_overwrite_test();
LAB_001130bb:
    pfStackY_d10 = (fdb_kvs_handle *)0x1130c0;
    compact_upto_overwrite_test();
LAB_001130c0:
    pfStackY_d10 = (fdb_kvs_handle *)0x1130c5;
    compact_upto_overwrite_test();
LAB_001130c5:
    pfStackY_d10 = (fdb_kvs_handle *)0x1130ca;
    compact_upto_overwrite_test();
LAB_001130ca:
    pfStackY_d10 = (fdb_kvs_handle *)0x1130cf;
    compact_upto_overwrite_test();
LAB_001130cf:
    pfStackY_d10 = (fdb_kvs_handle *)0x1130d4;
    compact_upto_overwrite_test();
LAB_001130d4:
    pfStackY_d10 = (fdb_kvs_handle *)compact_with_snapshot_open_test;
    compact_upto_overwrite_test();
    pcStackY_10a8 = (code *)0x1130f6;
    pfStackY_d38 = pfVar14;
    pfStackY_d30 = pfVar5;
    pfStackY_d28 = unaff_R13;
    pcStackY_d20 = pcVar6;
    pfStackY_d18 = doc_01;
    pfStackY_d10 = (fdb_kvs_handle *)pcVar7;
    gettimeofday(&tStackY_1060,(__timezone_ptr_t)0x0);
    pcStackY_10a8 = (code *)0x1130fb;
    memleak_start();
    pcStackY_10a8 = (code *)0x113108;
    fdb_get_default_config();
    pcStackY_10a8 = (code *)0x113115;
    fdb_get_default_kvs_config();
    fStackY_1038.compaction_cb_ctx = &uStackY_1080;
    uStackY_1080 = 0;
    uStackY_1078 = 0;
    pfStackY_1070 = (fdb_kvs_handle *)0x0;
    fStackY_1038.wal_threshold = 0x400;
    fStackY_1038.flags = 1;
    fStackY_1038.compaction_cb = compaction_cb_get;
    fStackY_1038.compaction_cb_mask = 0x1b;
    pcStackY_10a8 = (code *)0x11315b;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_10a8 = (code *)0x113170;
    fdb_open((fdb_file_handle **)&pfStackY_10a0,"./compact_test1",&fStackY_1038);
    pcStackY_10a8 = (code *)0x11318a;
    fdb_kvs_open((fdb_file_handle *)pfStackY_10a0,&pfStackY_1088,"db",&fStackY_1050);
    pcStackY_10a8 = (code *)0x11319d;
    fdb_kvs_open((fdb_file_handle *)pfStackY_10a0,&pfStackY_1098,"db",&fStackY_1050);
    uVar11 = 0;
    do {
      pcStackY_10a8 = (code *)0x1131c9;
      sprintf((char *)apfStackY_e40,"key%04d",uVar11);
      pcStackY_10a8 = (code *)0x1131d8;
      sprintf(acStackY_f40,"body%04d",uVar11);
      pfVar5 = pfStackY_1088;
      pcStackY_10a8 = (code *)0x1131e5;
      sVar3 = strlen((char *)apfStackY_e40);
      pcStackY_10a8 = (code *)0x1131f0;
      sVar4 = strlen(acStackY_f40);
      pcStackY_10a8 = (code *)0x113204;
      ptr_handle = apfStackY_e40;
      pfVar14 = pfVar5;
      fVar1 = fdb_set_kv(pfVar5,apfStackY_e40,sVar3,acStackY_f40,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_10a8 = (code *)0x1132c9;
        compact_with_snapshot_open_test();
        goto LAB_001132c9;
      }
      uVar9 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar9;
    } while (uVar9 != 100000);
    ptr_handle = (fdb_kvs_handle **)0x1;
    pcStackY_10a8 = (code *)0x113224;
    pfVar14 = pfStackY_10a0;
    fVar1 = fdb_commit((fdb_file_handle *)pfStackY_10a0,'\x01');
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStackY_1070 = pfStackY_1098;
      ptr_handle = (fdb_kvs_handle **)0x0;
      pcStackY_10a8 = (code *)0x113241;
      pfVar14 = pfStackY_10a0;
      fVar1 = fdb_compact((fdb_file_handle *)pfStackY_10a0,(char *)0x0);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132ce;
      ptr_handle = &pfStackY_1090;
      pcStackY_10a8 = (code *)0x11325d;
      pfVar14 = pfStackY_1098;
      fVar1 = fdb_snapshot_open(pfStackY_1098,ptr_handle,100000);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132d3;
      pcStackY_10a8 = (code *)0x11326b;
      fdb_kvs_close(pfStackY_1090);
      pcStackY_10a8 = (code *)0x113274;
      fVar1 = fdb_close((fdb_file_handle *)pfStackY_10a0);
      pfVar14 = pfStackY_10a0;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132d8;
      pcStackY_10a8 = (code *)0x11327d;
      fVar1 = fdb_shutdown();
      pfVar14 = pfStackY_10a0;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar6 = "%s PASSED\n";
        if (compact_with_snapshot_open_test()::__test_pass != '\0') {
          pcVar6 = "%s FAILED\n";
        }
        pcStackY_10a8 = (code *)0x1132b2;
        iVar2 = fprintf(_stderr,pcVar6,"compact with snapshot_open test");
        return iVar2;
      }
    }
    else {
LAB_001132c9:
      pcStackY_10a8 = (code *)0x1132ce;
      compact_with_snapshot_open_test();
LAB_001132ce:
      pcStackY_10a8 = (code *)0x1132d3;
      compact_with_snapshot_open_test();
LAB_001132d3:
      pcStackY_10a8 = (code *)0x1132d8;
      compact_with_snapshot_open_test();
LAB_001132d8:
      pcStackY_10a8 = (code *)0x1132dd;
      compact_with_snapshot_open_test();
    }
    pcStackY_10a8 = compaction_cb_get;
    compact_with_snapshot_open_test();
    pcStackY_10f0 = (code *)0x1132fe;
    sStackY_10b8 = sVar3;
    ppfStackY_10b0 = apfStackY_e40;
    pcStackY_10a8 = (code *)uVar11;
    gettimeofday(&tStackY_10c8,(__timezone_ptr_t)0x0);
    if ((int)ptr_handle == 2) {
      if (extraout_RDX == 0) {
        pcStackY_10f0 = (code *)0x11330d;
        compaction_cb_get();
        goto LAB_0011330d;
      }
    }
    else {
LAB_0011330d:
      if (extraout_RDX != 0) goto LAB_00113374;
    }
    pcStackY_10f0 = (code *)0x113324;
    fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)pfVar14,&pfStackY_10e0,&uStackY_10d0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_10f0 = (code *)0x113348;
      fVar1 = fdb_snapshot_open((fdb_kvs_handle *)(pfStackY_1098->kvs_config).custom_cmp_param,
                                &pfStackY_10d8,pfStackY_10e0->kvs_markers->seqnum);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011336a;
      pcStackY_10f0 = (code *)0x113356;
      fVar1 = fdb_kvs_close(pfStackY_10d8);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        return 0;
      }
    }
    else {
      pcStackY_10f0 = (code *)0x11336a;
      compaction_cb_get();
LAB_0011336a:
      pcStackY_10f0 = (code *)0x11336f;
      compaction_cb_get();
    }
    pcStackY_10f0 = (code *)0x113374;
    compaction_cb_get();
LAB_00113374:
    pcStackY_10f0 = compact_with_snapshot_open_multi_kvs_test;
    compaction_cb_get();
    pcStackY_10f8 = "body%04d";
    pfStackY_1108 = pfVar5;
    pcStackY_14a8 = (code *)0x113396;
    pcStackY_1110 = acStackY_f40;
    pcStackY_10f0 = (code *)((ulong)ptr_handle & 0xffffffff);
    gettimeofday(&tStackY_1440,(__timezone_ptr_t)0x0);
    pcStackY_14a8 = (code *)0x11339b;
    memleak_start();
    pcStackY_14a8 = (code *)0x1133ab;
    fdb_get_default_config();
    pcStackY_14a8 = (code *)0x1133b8;
    fdb_get_default_kvs_config();
    fStackY_1418.compaction_cb_ctx = &uStackY_1460;
    uStackY_1460 = 0;
    uStackY_1458 = 0;
    uStackY_1450 = 0;
    fStackY_1418.wal_threshold = 0x400;
    fStackY_1418.flags = 1;
    fStackY_1418.compaction_cb = compaction_cb_markers;
    fStackY_1418.compaction_cb_mask = 0x1b;
    pcStackY_14a8 = (code *)0x1133fe;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_14a8 = (code *)0x113415;
    fdb_open(&pfStackY_1498,"./compact_test1",&fStackY_1418);
    pcStackY_14a8 = (code *)0x11342c;
    fdb_kvs_open(pfStackY_1498,&pfStackY_1468,"db1",&fStackY_1430);
    pcStackY_14a8 = (code *)0x113443;
    fdb_kvs_open(pfStackY_1498,&pfStackY_1470,"db2",&fStackY_1430);
    pcStackY_14a8 = (code *)0x11345a;
    fdb_kvs_open(pfStackY_1498,&pfStackY_1478,"db3",&fStackY_1430);
    pcStackY_14a8 = (code *)0x113471;
    fdb_kvs_open(pfStackY_1498,&pfStackY_1480,"db4",&fStackY_1430);
    pcStackY_14a8 = (code *)0x113488;
    fdb_kvs_open(pfStackY_1498,&pfStackY_1488,"db5",&fStackY_1430);
    uVar11 = 0;
    do {
      iVar2 = (int)uVar11;
      if (iVar2 == 5) goto LAB_0011360c;
      uVar11 = 0;
      iStackY_148c = iVar2;
      do {
        pcStackY_14a8 = (code *)0x1134c6;
        sprintf(acStackY_1220,"key%04d",uVar11);
        pcStackY_14a8 = (code *)0x1134d5;
        sprintf(acStackY_1320,"body%04d",uVar11);
        pfVar5 = pfStackY_1468;
        pcStackY_14a8 = (code *)0x1134e2;
        sVar3 = strlen(acStackY_1220);
        pcStackY_14a8 = (code *)0x1134f0;
        sVar4 = strlen(acStackY_1320);
        pcStackY_14a8 = (code *)0x113504;
        fdb_set_kv(pfVar5,acStackY_1220,sVar3,acStackY_1320,sVar4);
        pfVar5 = pfStackY_1470;
        pcStackY_14a8 = (code *)0x113511;
        sVar3 = strlen(acStackY_1220);
        pcStackY_14a8 = (code *)0x11351c;
        sVar4 = strlen(acStackY_1320);
        pcStackY_14a8 = (code *)0x113530;
        fdb_set_kv(pfVar5,acStackY_1220,sVar3,acStackY_1320,sVar4);
        pfVar5 = pfStackY_1478;
        pcStackY_14a8 = (code *)0x11353d;
        sVar3 = strlen(acStackY_1220);
        pcStackY_14a8 = (code *)0x113548;
        sVar4 = strlen(acStackY_1320);
        pcStackY_14a8 = (code *)0x11355c;
        fdb_set_kv(pfVar5,acStackY_1220,sVar3,acStackY_1320,sVar4);
        pfVar5 = pfStackY_1480;
        pcStackY_14a8 = (code *)0x113569;
        sVar3 = strlen(acStackY_1220);
        pcStackY_14a8 = (code *)0x113574;
        sVar4 = strlen(acStackY_1320);
        pcStackY_14a8 = (code *)0x113588;
        fdb_set_kv(pfVar5,acStackY_1220,sVar3,acStackY_1320,sVar4);
        pfVar14 = pfStackY_1488;
        pcStackY_14a8 = (code *)0x113595;
        pfVar5 = (fdb_kvs_handle *)strlen(acStackY_1220);
        pcStackY_14a8 = (code *)0x1135a0;
        sVar3 = strlen(acStackY_1320);
        pcStackY_14a8 = (code *)0x1135be;
        fdb_set_kv(pfVar14,acStackY_1220,(size_t)pfVar5,acStackY_1320,sVar3);
        uVar9 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar9;
      } while (uVar9 != 1000);
      pcStackY_14a8 = (code *)0x1135db;
      pfVar12 = pfStackY_1498;
      fVar1 = fdb_commit(pfStackY_1498,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_14a8 = (code *)0x11366b;
        compact_with_snapshot_open_multi_kvs_test();
        goto LAB_0011366b;
      }
      uVar11 = (ulong)(iStackY_148c + 1U);
      uStackY_1460 = CONCAT44(uStackY_1460._4_4_,(iStackY_148c + 1U) * 1000);
      pcStackY_14a8 = (code *)0x1135ff;
      fVar1 = fdb_compact(pfStackY_1498,(char *)0x0);
    } while (fVar1 == FDB_RESULT_SUCCESS);
    pcStackY_14a8 = (code *)0x11360c;
    compact_with_snapshot_open_multi_kvs_test();
LAB_0011360c:
    pcStackY_14a8 = (code *)0x113616;
    pfVar12 = pfStackY_1498;
    fVar1 = fdb_close(pfStackY_1498);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_14a8 = (code *)0x11361f;
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar6 = "%s PASSED\n";
        if (compact_with_snapshot_open_multi_kvs_test()::__test_pass != '\0') {
          pcVar6 = "%s FAILED\n";
        }
        pcStackY_14a8 = (code *)0x113654;
        iVar2 = fprintf(_stderr,pcVar6,"compact with snapshot_open multi kvs test");
        return iVar2;
      }
    }
    else {
LAB_0011366b:
      pcStackY_14a8 = (code *)0x113670;
      compact_with_snapshot_open_multi_kvs_test();
    }
    pcStackY_14a8 = compaction_cb_markers;
    compact_with_snapshot_open_multi_kvs_test();
    pcStackY_14b0 = "body%04d";
    pcStackY_14d0 = "key%04d";
    pcStackY_1520 = (code *)0x11369a;
    pcStackY_14c8 = acStackY_1320;
    pfStackY_14c0 = pfVar5;
    pcStackY_14b8 = acStackY_1220;
    pcStackY_14a8 = (code *)uVar11;
    gettimeofday(&tStackY_14e0,(__timezone_ptr_t)0x0);
    pcStackY_1520 = (code *)0x1136a4;
    fdb_get_default_kvs_config();
    iVar2 = *(int *)&pfStackY_1498->root;
    pcStackY_1520 = (code *)0x1136b7;
    fVar1 = fdb_get_all_snap_markers(pfVar12,&pfStackY_1518,&uStackY_1510);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      if (pfStackY_1518->num_kvs_markers != 6) {
        pcStackY_1520 = (code *)0x113799;
        compaction_cb_markers();
      }
      seqnum = pfStackY_1518->kvs_markers->seqnum;
      if (seqnum == (long)iVar2) {
        if (uStackY_1510 != 0) {
          uVar11 = 0;
          do {
            if (pfStackY_1518[uVar11].num_kvs_markers != 0) {
              lVar15 = 0;
              uVar16 = 0;
              do {
                pcVar6 = *(char **)((long)&(pfStackY_1518[uVar11].kvs_markers)->kv_store_name +
                                   lVar15);
                if (pcVar6 != (char *)0x0) {
                  pcStackY_1520 = (code *)0x11372e;
                  fdb_kvs_open(pfVar12,&pfStackY_1508,pcVar6,&fStackY_14f8);
                  pcStackY_1520 = (code *)0x113740;
                  fVar1 = fdb_snapshot_open(pfStackY_1508,&pfStackY_1500,seqnum);
                  if (fVar1 == FDB_RESULT_SUCCESS) {
                    pcStackY_1520 = (code *)0x11374e;
                    fVar1 = fdb_kvs_close(pfStackY_1500);
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      pcStackY_1520 = (code *)0x1137a3;
                      compaction_cb_markers();
                      goto LAB_001137a3;
                    }
                    pcStackY_1520 = (code *)0x11375c;
                    fVar1 = fdb_kvs_close(pfStackY_1508);
                    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113760;
                  }
                  else {
LAB_001137a3:
                    pcStackY_1520 = (code *)0x1137a8;
                    compaction_cb_markers();
                  }
                  pcStackY_1520 = (code *)0x1137ad;
                  compaction_cb_markers();
                  goto LAB_001137ad;
                }
LAB_00113760:
                uVar16 = uVar16 + 1;
                lVar15 = lVar15 + 0x10;
              } while (uVar16 < (ulong)pfStackY_1518[uVar11].num_kvs_markers);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < uStackY_1510);
        }
        return 0;
      }
    }
    else {
LAB_001137ad:
      pcStackY_1520 = (code *)0x1137b2;
      compaction_cb_markers();
    }
    pcStackY_1520 = db_compact_during_compaction_cancellation;
    compaction_cb_markers();
    gettimeofday(&tStackY_1628,(__timezone_ptr_t)0x0);
    fdb_get_default_config();
    fStackY_1618.compaction_cb = cb_cancel_test;
    fStackY_1618.compaction_cb_ctx = (void *)0x0;
    fStackY_1618.compaction_cb_mask = 0x11;
    fVar1 = fdb_open(&pfStackY_1630,"compact_test",&fStackY_1618);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xcac);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
    }
    fVar1 = fdb_compact(pfStackY_1630,(char *)0x0);
    if (((uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) < 0x2e) &&
       ((0x200004000001U >> ((ulong)(uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) & 0x3f) & 1) != 0)) {
      fdb_close(pfStackY_1630);
      pthread_exit((void *)0x0);
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcb1);
    __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
  }
  pfStackY_d10 = (fdb_kvs_handle *)0x112abc;
  fVar1 = fdb_kvs_open(pfStack_ce0,&pfStack_cd8,"db",&fStack_ca0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130ac;
  pcVar7 = (char *)CONCAT71((int7)((ulong)pcVar7 >> 8),uStack_cec == 0);
  pcStack_cd0 = pcVar6 + 0x1a;
  pfVar5 = (fdb_kvs_handle *)(auStack_b78 + 0x30);
  unaff_R13 = (fdb_kvs_handle *)auStack_b78;
  doc_01 = (fdb_kvs_handle *)0x0;
  do {
    uVar10 = (uint)doc_01;
    uVar9 = uVar10 + (int)((ulong)doc_01 / 5) * -5;
    pfStackY_d10 = (fdb_kvs_handle *)0x112b17;
    sprintf((char *)pfVar5,"key%06d",(ulong)uVar9);
    builtin_strncpy(pcVar6,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
    builtin_strncpy(pcStack_cd0,"<end>",6);
    pcVar17 = "updated_value%08d";
    if (uVar10 < 5) {
      pcVar17 = "value%08d";
    }
    pfStackY_d10 = (fdb_kvs_handle *)0x112b5a;
    sprintf(pcVar6,pcVar17,(ulong)uVar9);
    pfVar14 = pfStack_cd8;
    pfStackY_d10 = (fdb_kvs_handle *)0x112b67;
    sVar3 = strlen((char *)pfVar5);
    pfStackY_d10 = (fdb_kvs_handle *)0x112b7f;
    fVar1 = fdb_set_kv(pfVar14,pfVar5,sVar3 + 1,pcVar6,0x20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011305f;
    pfVar8 = doc_01;
    if (uStack_cec == 3) {
LAB_00112ba0:
      pcVar7 = (char *)((ulong)pfVar8 & 0xffffffffffffff01);
    }
    else if (uStack_cec == 2) {
      pfVar8 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)doc_01 >> 8),~(byte)doc_01);
      goto LAB_00112ba0;
    }
    pfStackY_d10 = (fdb_kvs_handle *)0x112bb2;
    fVar1 = fdb_commit(pfStack_ce0,(fdb_commit_opt_t)pcVar7);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113064;
    pfStackY_d10 = (fdb_kvs_handle *)0x112bc7;
    fVar1 = fdb_get_kvs_info(pfStack_cd8,(fdb_kvs_info *)unaff_R13);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113069;
    doc_01 = (fdb_kvs_handle *)(ulong)(uVar10 + 1);
  } while (uVar10 + 1 != 10);
  pfStackY_d10 = (fdb_kvs_handle *)0x112bf0;
  fVar1 = fdb_get_all_snap_markers(pfStack_ce0,&pfStack_cc0,(uint64_t *)&iStack_cc8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130b1;
  pfVar14 = (fdb_kvs_handle *)(CONCAT44(uStack_cc4,iStack_cc8) >> 1);
  iVar2 = (int)pfVar14;
  pfStackY_d10 = (fdb_kvs_handle *)0x112c21;
  fVar1 = fdb_compact_upto(pfStack_ce0,"./compact_test2",pfStack_cc0[iVar2].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130b6;
  if (-1 < (int)(iStack_cc8 - 1U)) {
    pfVar14 = (fdb_kvs_handle *)(ulong)(iStack_cc8 - 1U);
    lStack_ca8 = (long)iVar2;
    pfVar5 = (fdb_kvs_handle *)(auStack_b78 + 0x30);
    do {
      doc_01 = (fdb_kvs_handle *)(pfStack_cc0[(long)pfVar14].kvs_markers)->seqnum;
      pfStackY_d10 = (fdb_kvs_handle *)0x112c6e;
      fVar1 = fdb_snapshot_open(pfStack_cd8,&pfStack_cb8,(fdb_seqnum_t)doc_01);
      if (lStack_ca8 < (long)pfVar14) {
        pfVar8 = pfVar14;
        if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113089;
      }
      else {
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011308e;
        pfStackY_d10 = (fdb_kvs_handle *)0x112caf;
        pfStack_cb0 = pfVar14;
        fVar1 = fdb_iterator_init(pfStack_cb8,&pfStack_cf8,(void *)0x0,0,(void *)0x0,0,0);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113093;
        doc_01 = (fdb_kvs_handle *)((long)&doc_01[-1].bub_ctx.handle + 3);
        pfVar14 = (fdb_kvs_handle *)0x0;
        do {
          pfStack_ce8 = (fdb_kvs_handle *)0x0;
          pfStackY_d10 = (fdb_kvs_handle *)0x112cd5;
          fVar1 = fdb_iterator_get(pfStack_cf8,(fdb_doc **)&pfStack_ce8);
          if (fVar1 != FDB_RESULT_SUCCESS) break;
          pfStackY_d10 = (fdb_kvs_handle *)0x112cf0;
          sprintf((char *)pfVar5,"key%06d",(ulong)pfVar14 & 0xffffffff);
          builtin_strncpy(pcVar6,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
          builtin_strncpy(pcStack_cd0,"<end>",6);
          pcVar7 = "value%08d";
          if (pfVar14 < doc_01) {
            pcVar7 = "updated_value%08d";
          }
          pfStackY_d10 = (fdb_kvs_handle *)0x112d32;
          sprintf(pcVar6,pcVar7,(ulong)pfVar14 & 0xffffffff);
          pcVar7 = (char *)pfStack_ce8;
          unaff_R13 = (fdb_kvs_handle *)pfStack_ce8->op_stats;
          pfStackY_d10 = (fdb_kvs_handle *)0x112d4a;
          iVar2 = bcmp(unaff_R13,pfVar5,*(size_t *)&pfStack_ce8->kvs_config);
          if (iVar2 != 0) {
            pfStackY_d10 = (fdb_kvs_handle *)0x113054;
            compact_upto_overwrite_test();
LAB_00113054:
            pfStackY_d10 = (fdb_kvs_handle *)0x11305f;
            compact_upto_overwrite_test();
            goto LAB_0011305f;
          }
          unaff_R13 = (fdb_kvs_handle *)(((fdb_kvs_handle *)pcVar7)->field_6).seqtree;
          pfStackY_d10 = (fdb_kvs_handle *)0x112d65;
          iVar2 = bcmp(unaff_R13,pcVar6,
                       (size_t)(((fdb_kvs_handle *)pcVar7)->kvs_config).custom_cmp_param);
          if (iVar2 != 0) goto LAB_00113054;
          pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
          pfStackY_d10 = (fdb_kvs_handle *)0x112d78;
          fdb_doc_free((fdb_doc *)pcVar7);
          pfStackY_d10 = (fdb_kvs_handle *)0x112d82;
          fVar1 = fdb_iterator_next(pfStack_cf8);
        } while (fVar1 == FDB_RESULT_SUCCESS);
        pfStackY_d10 = (fdb_kvs_handle *)0x112d94;
        fVar1 = fdb_iterator_close(pfStack_cf8);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113098;
        if ((int)pfVar14 != 5) goto LAB_001130a2;
        pfStackY_d10 = (fdb_kvs_handle *)0x112daf;
        fVar1 = fdb_kvs_close(pfStack_cb8);
        pfVar14 = pfStack_cb0;
        pfVar8 = pfStack_cb0;
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011309d;
      }
      pfVar14 = (fdb_kvs_handle *)((long)&pfVar8[-1].bub_ctx.handle + 7);
    } while (0 < (long)pfVar8);
  }
  pfVar5 = (fdb_kvs_handle *)(auStack_b78 + 0x30);
  pfStackY_d10 = (fdb_kvs_handle *)0x112dec;
  fVar1 = fdb_iterator_init(pfStack_cd8,&pfStack_cf8,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130bb;
  unaff_R13 = (fdb_kvs_handle *)(auStack_b78 + 0x30);
  pcVar7 = "updated_value%08d";
  pfVar14 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_ce8 = (fdb_kvs_handle *)0x0;
    pfStackY_d10 = (fdb_kvs_handle *)0x112e1d;
    fVar1 = fdb_iterator_get(pfStack_cf8,(fdb_doc **)&pfStack_ce8);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    pfStackY_d10 = (fdb_kvs_handle *)0x112e38;
    sprintf((char *)unaff_R13,"key%06d",pfVar14);
    builtin_strncpy(pcVar6,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
    builtin_strncpy(pcStack_cd0,"<end>",6);
    pfStackY_d10 = (fdb_kvs_handle *)0x112e68;
    sprintf(pcVar6,"updated_value%08d",pfVar14);
    doc_01 = pfStack_ce8;
    pfVar5 = (fdb_kvs_handle *)pfStack_ce8->op_stats;
    pfStackY_d10 = (fdb_kvs_handle *)0x112e7f;
    iVar2 = bcmp(pfVar5,unaff_R13,*(size_t *)&pfStack_ce8->kvs_config);
    if (iVar2 != 0) goto LAB_0011306e;
    pfVar5 = (fdb_kvs_handle *)(doc_01->field_6).seqtree;
    pfStackY_d10 = (fdb_kvs_handle *)0x112e9a;
    iVar2 = bcmp(pfVar5,pcVar6,(size_t)(doc_01->kvs_config).custom_cmp_param);
    if (iVar2 != 0) goto LAB_0011307e;
    pfVar14 = (fdb_kvs_handle *)(ulong)((int)pfVar14 + 1);
    pfStackY_d10 = (fdb_kvs_handle *)0x112eac;
    fdb_doc_free((fdb_doc *)doc_01);
    pfStackY_d10 = (fdb_kvs_handle *)0x112eb6;
    fVar1 = fdb_iterator_next(pfStack_cf8);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pfStackY_d10 = (fdb_kvs_handle *)0x112ec8;
  fVar1 = fdb_iterator_close(pfStack_cf8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130c0;
  if ((int)pfVar14 != 5) goto LAB_001130c5;
  pfStackY_d10 = (fdb_kvs_handle *)0x112ee8;
  fVar1 = fdb_free_snap_markers(pfStack_cc0,CONCAT44(uStack_cc4,iStack_cc8));
  uVar9 = uStack_cec;
  pfVar14 = (fdb_kvs_handle *)(ulong)uStack_cec;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130ca;
  pfStackY_d10 = (fdb_kvs_handle *)0x112efc;
  free(pcVar6);
  pfStackY_d10 = (fdb_kvs_handle *)0x112f06;
  fVar1 = fdb_close(pfStack_ce0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130cf;
  pfStackY_d10 = (fdb_kvs_handle *)0x112f13;
  fVar1 = fdb_shutdown();
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130d4;
  pfStackY_d10 = (fdb_kvs_handle *)0x112f20;
  memleak_end();
  builtin_strncpy(acStack_c88 + 0x10,"rwrite test",0xc);
  builtin_strncpy(acStack_c88,"compact upto ove",0x10);
  switch(uVar9) {
  case 0:
    pfStackY_d10 = (fdb_kvs_handle *)0x112f66;
    sVar3 = strlen(acStack_c88);
    builtin_strncpy(acStack_c88 + sVar3," (HB+trie)",0xb);
    break;
  case 1:
    pfStackY_d10 = (fdb_kvs_handle *)0x112fea;
    sVar3 = strlen(acStack_c88);
    builtin_strncpy(acStack_c88 + sVar3," (WAL)",7);
    break;
  case 2:
    pfStackY_d10 = (fdb_kvs_handle *)0x112f92;
    sVar3 = strlen(acStack_c88);
    builtin_strncpy(acStack_c88 + sVar3 + 0xe,"ie/WAL)",8);
    uVar18._0_1_ = ' ';
    uVar18._1_1_ = 'H';
    uVar18._2_1_ = 'B';
    uVar18._3_1_ = '+';
    uVar19._0_1_ = 't';
    uVar19._1_1_ = 'r';
    uVar19._2_1_ = 'i';
    uVar19._3_1_ = 'e';
    goto LAB_00112fd3;
  case 3:
    pfStackY_d10 = (fdb_kvs_handle *)0x112fba;
    sVar3 = strlen(acStack_c88);
    builtin_strncpy(acStack_c88 + sVar3 + 0xe,"B+trie)",8);
    uVar18._0_1_ = ' ';
    uVar18._1_1_ = 'W';
    uVar18._2_1_ = 'A';
    uVar18._3_1_ = 'L';
    uVar19._0_1_ = '/';
    uVar19._1_1_ = 'H';
    uVar19._2_1_ = 'B';
    uVar19._3_1_ = '+';
LAB_00112fd3:
    pcVar6 = acStack_c88 + sVar3;
    pcVar6[0] = ' ';
    pcVar6[1] = '(';
    pcVar6[2] = 'm';
    pcVar6[3] = 'i';
    pcVar6 = acStack_c88 + sVar3 + 4;
    pcVar6[0] = 'x';
    pcVar6[1] = 'e';
    pcVar6[2] = 'd';
    pcVar6[3] = ',';
    *(undefined4 *)(acStack_c88 + sVar3 + 8) = uVar18;
    *(undefined4 *)(acStack_c88 + sVar3 + 0xc) = uVar19;
  }
  pcVar6 = "%s PASSED\n";
  if (compact_upto_overwrite_test(int)::__test_pass != '\0') {
    pcVar6 = "%s FAILED\n";
  }
  pfStackY_d10 = (fdb_kvs_handle *)0x113032;
  iVar2 = fprintf(_stderr,pcVar6,acStack_c88);
  return iVar2;
}

Assistant:

static int compaction_del_cb(fdb_file_handle *fhandle,
                             fdb_compaction_status status,
                             const char *kv_name,
                             fdb_doc *doc, uint64_t old_offset,
                             uint64_t new_offset,
                             void *ctx)
{
    TEST_INIT();
    fdb_status s;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db = *(fdb_kvs_handle **)ctx;
    int i;
    int n = 10; // if changing this change caller function too
    char keybuf[256];
    (void) doc;
    (void) new_offset;
    (void) old_offset;

    if (status == FDB_CS_BEGIN) {
        TEST_CHK(false);
    } else if (status == FDB_CS_END) {
        TEST_CHK(!kv_name);
        if (db) { // At end of first phase, mutate more docs...
            s = fdb_open(&dbfile, "./compact_test1", &fhandle->root->config);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            fdb_kvs_open_default(dbfile, &db, &db->kvs_config);
            for (i = 0; i < n; ++i){
                sprintf(keybuf, "key%d", i);
                s = fdb_del_kv(db, keybuf, strlen(keybuf));
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            // Now insert and delete a bunch of keys (all in WAL)
            for (i = 0; i < n; ++i){
                sprintf(keybuf, "KEY%d", i);
                s = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_del_kv(db, keybuf, strlen(keybuf));
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            sprintf(keybuf, "key%d", i);
            s = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            fdb_close(dbfile);
            *(fdb_kvs_handle **)ctx = NULL; // Don't run in 2nd, 3rd phases
        }
    } else if (status == FDB_CS_FLUSH_WAL) {
        TEST_CHK(false);
    } else if (status == FDB_CS_MOVE_DOC) {
        TEST_CHK(false);
    } else { // FDB_CS_BATCH_MOVE
        TEST_CHK(false);
    }
    return 0;
}